

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O1

void __thiscall llvm::Twine::printOneChild(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  char *pcVar1;
  unsigned_long N;
  long N_00;
  uint uVar2;
  undefined7 in_register_00000009;
  void *__buf;
  int iVar3;
  
  iVar3 = (int)CONCAT71(in_register_00000009,Kind);
  uVar2 = iVar3 - 2;
  if (0xd < uVar2) {
    return;
  }
  switch(iVar3) {
  case 2:
    print(Ptr.twine,OS);
    return;
  case 3:
    raw_ostream::operator<<(OS,Ptr.cString);
    return;
  case 4:
    iVar3 = ((Ptr.twine)->LHS).decI;
    __buf = *(void **)&((Ptr.smallString)->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    break;
  case 5:
    raw_ostream::operator<<(OS,*Ptr.stringRef);
    return;
  case 6:
    iVar3 = ((Ptr.twine)->LHS).decI;
    __buf = (void *)(ulong)((Ptr.twine)->RHS).decUI;
    break;
  case 7:
    raw_ostream::operator<<(OS,Ptr.formatvObject);
    return;
  case 8:
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar1 + 1;
      *pcVar1 = Ptr.character;
      return;
    }
    raw_ostream::write(OS,Ptr.decUI & 0xff,Ptr.twine,
                       (long)&switchD_001aad72::switchdataD_0020d294 +
                       (long)(int)(&switchD_001aad72::switchdataD_0020d294)[uVar2]);
    return;
  case 9:
    N = (ulong)Ptr.twine & 0xffffffff;
    goto LAB_001aadcb;
  case 10:
    N_00 = (long)(int)Ptr.decUI;
    goto LAB_001aae17;
  case 0xb:
    N = *Ptr.decUL;
LAB_001aadcb:
    raw_ostream::operator<<(OS,N);
    return;
  case 0xc:
    N_00 = *Ptr.decL;
LAB_001aae17:
    raw_ostream::operator<<(OS,N_00);
    return;
  case 0xd:
    raw_ostream::operator<<(OS,*Ptr.decULL);
    return;
  case 0xe:
    raw_ostream::operator<<(OS,*Ptr.decLL);
    return;
  case 0xf:
    raw_ostream::write_hex(OS,*Ptr.decULL);
    return;
  }
  raw_ostream::write(OS,iVar3,__buf,
                     (long)&switchD_001aad72::switchdataD_0020d294 +
                     (long)(int)(&switchD_001aad72::switchdataD_0020d294)[uVar2]);
  return;
}

Assistant:

void Twine::printOneChild(raw_ostream &OS, Child Ptr,
                          NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind: break;
  case Twine::EmptyKind: break;
  case Twine::TwineKind:
    Ptr.twine->print(OS);
    break;
  case Twine::CStringKind:
    OS << Ptr.cString;
    break;
  case Twine::StdStringKind:
    OS << *Ptr.stdString;
    break;
  case Twine::StringRefKind:
    OS << *Ptr.stringRef;
    break;
  case Twine::SmallStringKind:
    OS << *Ptr.smallString;
    break;
  case Twine::FormatvObjectKind:
    OS << *Ptr.formatvObject;
    break;
  case Twine::CharKind:
    OS << Ptr.character;
    break;
  case Twine::DecUIKind:
    OS << Ptr.decUI;
    break;
  case Twine::DecIKind:
    OS << Ptr.decI;
    break;
  case Twine::DecULKind:
    OS << *Ptr.decUL;
    break;
  case Twine::DecLKind:
    OS << *Ptr.decL;
    break;
  case Twine::DecULLKind:
    OS << *Ptr.decULL;
    break;
  case Twine::DecLLKind:
    OS << *Ptr.decLL;
    break;
  case Twine::UHexKind:
    OS.write_hex(*Ptr.uHex);
    break;
  }
}